

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddRectFilledMultiColor
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col_upr_left,ImU32 col_upr_right,
          ImU32 col_bot_right,ImU32 col_bot_left)

{
  float fVar1;
  ImVec2 IVar2;
  ImDrawIdx *pIVar3;
  ImDrawVert *pIVar4;
  
  if (0xffffff < (col_upr_right | col_upr_left | col_bot_right | col_bot_left)) {
    IVar2 = this->_Data->TexUvWhitePixel;
    PrimReserve(this,6,4);
    *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
    pIVar3 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar3[1] = (short)this->_VtxCurrentIdx + 1;
    pIVar3 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar3[1] = (short)this->_VtxCurrentIdx + 2;
    pIVar3 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar3[1] = (ImDrawIdx)this->_VtxCurrentIdx;
    pIVar3 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar3[1] = (short)this->_VtxCurrentIdx + 2;
    pIVar3 = this->_IdxWritePtr;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar3[1] = (short)this->_VtxCurrentIdx + 3;
    this->_IdxWritePtr = this->_IdxWritePtr + 1;
    this->_VtxWritePtr->pos = *p_min;
    this->_VtxWritePtr->uv = IVar2;
    this->_VtxWritePtr->col = col_upr_left;
    pIVar4 = this->_VtxWritePtr;
    this->_VtxWritePtr = pIVar4 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    fVar1 = p_min->y;
    pIVar4[1].pos.x = p_max->x;
    pIVar4[1].pos.y = fVar1;
    this->_VtxWritePtr->uv = IVar2;
    this->_VtxWritePtr->col = col_upr_right;
    pIVar4 = this->_VtxWritePtr;
    this->_VtxWritePtr = pIVar4 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    pIVar4[1].pos = *p_max;
    this->_VtxWritePtr->uv = IVar2;
    this->_VtxWritePtr->col = col_bot_right;
    pIVar4 = this->_VtxWritePtr;
    this->_VtxWritePtr = pIVar4 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    fVar1 = p_max->y;
    pIVar4[1].pos.x = p_min->x;
    pIVar4[1].pos.y = fVar1;
    this->_VtxWritePtr->uv = IVar2;
    this->_VtxWritePtr->col = col_bot_left;
    this->_VtxWritePtr = this->_VtxWritePtr + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilledMultiColor(const ImVec2& p_min, const ImVec2& p_max, ImU32 col_upr_left, ImU32 col_upr_right, ImU32 col_bot_right, ImU32 col_bot_left)
{
    if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    PrimReserve(6, 4);
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 1)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 2));
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 2)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx + 3));
    PrimWriteVtx(p_min, uv, col_upr_left);
    PrimWriteVtx(ImVec2(p_max.x, p_min.y), uv, col_upr_right);
    PrimWriteVtx(p_max, uv, col_bot_right);
    PrimWriteVtx(ImVec2(p_min.x, p_max.y), uv, col_bot_left);
}